

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  pair<unsigned_short,_const_void_*> ts;
  pair<unsigned_short,_const_void_*> ts_00;
  int local_54;
  pair<unsigned_short,_const_void_*> local_50;
  int local_3c;
  pair<unsigned_short,_const_void_*> local_38;
  uchar local_28 [8];
  uint8_t buff2 [20];
  uint8_t buff [6];
  
  Logger::logful(&logger);
  stack0xfffffffffffffff2 = 0xefbeadde;
  local_28[0] = 0xde;
  local_28[1] = 0xad;
  local_28[2] = 0xbe;
  local_28[3] = 0xef;
  local_28[4] = 0xde;
  local_28[5] = 0xca;
  local_28[6] = 0xf8;
  local_28[7] = 0xed;
  buff2[0] = 0xca;
  buff2[1] = 0xfe;
  buff2[2] = 0xde;
  buff2[3] = 0xad;
  buff2[4] = 0xbe;
  buff2[5] = 0xef;
  buff2[6] = 0xde;
  buff2[7] = 0xca;
  buff2[8] = 0xf8;
  buff2[9] = 0xed;
  buff2[10] = 0xca;
  buff2[0xb] = 0xfe;
  local_3c = 0x14;
  std::pair<unsigned_short,_const_void_*>::pair<int,_unsigned_char_(&)[20],_true>
            (&local_38,&local_3c,(uchar (*) [20])local_28);
  ts._2_6_ = 0;
  ts.first = local_38.first;
  ts.second = local_38.second;
  Logless<std::pair<unsigned_short,void_const*>>(&logger,"Log me pls %%;",ts);
  Logless<signed_char,signed_char,signed_char>(&logger,"Log me pls %c; and %d; and %x;",'a','a','a')
  ;
  Logless<signed_char,signed_char>(&logger,"Log me pl  %d; and %x;",'a','a');
  Logless<unsigned_char>(&logger,"Log me pls %u;",'a');
  Logless<short>(&logger,"Log me pls %d;",-1);
  Logless<unsigned_short>(&logger,"Log me pls %u;",0xffff);
  Logless<int>(&logger,"Log me pls %d;",-1);
  Logless<unsigned_int>(&logger,"Log me pls %u;",0xffffffff);
  Logless<long>(&logger,"Log me pls %zd;",-1);
  Logless<unsigned_long>(&logger,"Log me pls %zu;",0xffffffffffffffff);
  Logless<float>(&logger,"Log me pls %f;",4.2);
  Logless<double>(&logger,"Log me pls %lf;",4.2);
  local_54 = 6;
  std::pair<unsigned_short,_const_void_*>::pair<int,_unsigned_char_(&)[6],_true>
            (&local_50,&local_54,(uchar (*) [6])(buff2 + 0x12));
  ts_00._2_6_ = 0;
  ts_00.first = local_50.first;
  ts_00.second = local_50.second;
  Logless<std::pair<unsigned_short,void_const*>>(&logger,"Log me pls %%;",ts_00);
  Logless<char_const*>(&logger,"Log me pls %s;","this iz string");
  runBM();
  Logger::flush(&logger);
  return 0;
}

Assistant:

int main()
{
    logger.logful();
    uint8_t buff[] = {0xde,0xad,0xbe,0xef,0xca,0xfe};
    uint8_t buff2[] = {0xde,0xad,0xbe,0xef,0xde,0xca,0xf8,0xed,0xca,0xfe,0xde,0xad,0xbe,0xef,0xde,0xca,0xf8,0xed,0xca,0xfe};

    Logless(logger, "Log me pls %%;", BufferLog(20, buff2));
    Logless(logger, "Log me pls %c; and %d; and %x;", int8_t('a'), int8_t('a'), int8_t('a'));
    Logless(logger, "Log me pl  %d; and %x;", int8_t('a'), int8_t('a'));
    Logless(logger, "Log me pls %u;", uint8_t('a'));
    Logless(logger, "Log me pls %d;", int16_t(0xffff));
    Logless(logger, "Log me pls %u;", uint16_t(0xffff));
    Logless(logger, "Log me pls %d;", int32_t(0xffffffff));
    Logless(logger, "Log me pls %u;", uint32_t(0xffffffff));
    Logless(logger, "Log me pls %zd;", int64_t(0xfffffffffffffffful));
    Logless(logger, "Log me pls %zu;", uint64_t(0xfffffffffffffffful));
    Logless(logger, "Log me pls %f;", float(4.2));
    Logless(logger, "Log me pls %lf;", double(4.2));
    Logless(logger, "Log me pls %%;", BufferLog(6, buff));
    Logless(logger, "Log me pls %s;", "this iz string");

    runBM();

    logger.flush();
}